

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_Xform *
ON_Xform::ScaleTransformation
          (ON_Xform *__return_storage_ptr__,ON_3dPoint *fixed_point,double x_scale_factor,
          double y_scale_factor,double z_scale_factor)

{
  long lVar1;
  double *pdVar2;
  ON_Xform *pOVar3;
  double *pdVar4;
  ON_Xform *pOVar5;
  ON_3dVector *pOVar6;
  byte bVar7;
  ON_3dVector delta;
  ON_Xform s;
  ON_Xform t1;
  ON_Xform t0;
  ON_3dVector local_230;
  ON_Xform local_218;
  ON_3dVector local_198;
  double local_180;
  double local_160;
  double local_140;
  ON_Xform local_118;
  ON_Xform local_98;
  
  bVar7 = 0;
  pdVar2 = (double *)&IdentityTransformation;
  pdVar4 = (double *)&local_218;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar4 = *pdVar2;
    pdVar2 = pdVar2 + 1;
    pdVar4 = pdVar4 + 1;
  }
  local_218.m_xform[0][0] = x_scale_factor;
  local_218.m_xform[1][1] = y_scale_factor;
  local_218.m_xform[2][2] = z_scale_factor;
  if ((((fixed_point->x != 0.0) || (NAN(fixed_point->x))) || (fixed_point->y != 0.0)) ||
     (((NAN(fixed_point->y) || (fixed_point->z != 0.0)) || (NAN(fixed_point->z))))) {
    ON_3dPoint::operator-(&local_230,fixed_point,&ON_3dPoint::Origin);
    ON_3dVector::operator-(&local_198,&local_230);
    pOVar3 = &IdentityTransformation;
    pOVar5 = &local_98;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar5->m_xform[0][0] = pOVar3->m_xform[0][0];
      pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    local_98.m_xform[0][3] = local_198.x;
    local_98.m_xform[1][3] = local_198.y;
    local_98.m_xform[2][3] = local_198.z;
    pOVar3 = &IdentityTransformation;
    pOVar6 = &local_198;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      (*(double (*) [4])&pOVar6->x)[0] = pOVar3->m_xform[0][0];
      pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_3dVector *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    local_180 = local_230.x;
    local_160 = local_230.y;
    local_140 = local_230.z;
    operator*(&local_118,(ON_Xform *)&local_198,&local_218);
    operator*(__return_storage_ptr__,&local_118,&local_98);
  }
  else {
    pdVar2 = (double *)&local_218;
    pdVar4 = (double *)__return_storage_ptr__;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar4 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      pdVar4 = pdVar4 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::ScaleTransformation(
  const ON_3dPoint& fixed_point,
  double x_scale_factor,
  double y_scale_factor,
  double z_scale_factor
)
{
  const ON_Xform s(ON_Xform::DiagonalTransformation(x_scale_factor, y_scale_factor, z_scale_factor));
  if ( fixed_point.x == 0.0 && fixed_point.y == 0.0 && fixed_point.z == 0.0 )
  {
    return s;
  }

  const ON_3dVector delta = fixed_point - ON_3dPoint::Origin;
  ON_Xform t0(ON_Xform::TranslationTransformation(-delta));
  ON_Xform t1(ON_Xform::TranslationTransformation(delta));
  return (t1*s*t0);
}